

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2::
~TestParsingMergeLite_RepeatedFieldsGenerator_Group2
          (TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *this)

{
  InternalMetadata *this_00;
  TestAllTypesLite *self;
  ulong uVar1;
  LogMessageFatal local_20;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    self = (this->field_0)._impl_.field1_;
    if (self != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::SharedDtor(&self->super_MessageLite);
      operator_delete(self,0x348);
      return;
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.cc"
             ,0x1c90,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestParsingMergeLite_RepeatedFieldsGenerator_Group2::~TestParsingMergeLite_RepeatedFieldsGenerator_Group2() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2)
  SharedDtor(*this);
}